

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

string * ReadFile_abi_cxx11_(string *__return_storage_ptr__,CStringRef name)

{
  ifstream ifs;
  byte abStack_1200 [488];
  char buffer [4096];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&ifs,name.data_,_S_in);
  do {
    std::istream::read((char *)&ifs,(long)buffer);
    std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)buffer);
  } while ((abStack_1200[*(long *)(_ifs + -0x18)] & 5) == 0);
  std::ifstream::~ifstream(&ifs);
  return __return_storage_ptr__;
}

Assistant:

std::string ReadFile(fmt::CStringRef name) {
  std::string data;
  std::ifstream ifs(name.c_str());
  enum { BUFFER_SIZE = 4096 };
  char buffer[BUFFER_SIZE];
  do {
    ifs.read(buffer, BUFFER_SIZE);
    data.append(buffer, static_cast<std::string::size_type>(ifs.gcount()));
  } while (ifs);
  return data;
}